

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Chapter::add_string(Chapter *this,char *title,char *language,char *country)

{
  int iVar1;
  bool bVar2;
  Display *this_00;
  Display *d;
  char *country_local;
  char *language_local;
  char *title_local;
  Chapter *this_local;
  
  bVar2 = ExpandDisplaysArray(this);
  if (bVar2) {
    iVar1 = this->displays_count_;
    this->displays_count_ = iVar1 + 1;
    this_00 = this->displays_ + iVar1;
    Display::Init(this_00);
    bVar2 = Display::set_title(this_00,title);
    if (bVar2) {
      bVar2 = Display::set_language(this_00,language);
      if (bVar2) {
        bVar2 = Display::set_country(this_00,country);
        if (bVar2) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Chapter::add_string(const char* title, const char* language,
                         const char* country) {
  if (!ExpandDisplaysArray())
    return false;

  Display& d = displays_[displays_count_++];
  d.Init();

  if (!d.set_title(title))
    return false;

  if (!d.set_language(language))
    return false;

  if (!d.set_country(country))
    return false;

  return true;
}